

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# request.c
# Opt level: O0

CURLcode Curl_req_set_upload_done(Curl_easy *data)

{
  CURLcode CVar1;
  curl_off_t cVar2;
  char *fmt;
  Curl_easy *data_local;
  
  *(uint *)&(data->req).field_0xd9 = *(uint *)&(data->req).field_0xd9 & 0xfffffeff | 0x100;
  (data->req).keepon = (data->req).keepon & 0xffffffbd;
  Curl_pgrsTime(data,TIMER_POSTRANSFER);
  Curl_creader_done(data,*(uint *)&(data->req).field_0xd9 >> 9 & 1);
  if ((*(uint *)&(data->req).field_0xd9 >> 9 & 1) == 0) {
    if ((data->req).writebytecount == 0) {
      if (((((*(uint *)&(data->req).field_0xd9 >> 3 & 1) == 0) && (data != (Curl_easy *)0x0)) &&
          ((*(ulong *)&(data->set).field_0x8ca >> 0x1c & 1) != 0)) &&
         (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))) {
        cVar2 = Curl_creader_total_length(data);
        fmt = "Request completely sent off";
        if (cVar2 != 0) {
          fmt = "We are completely uploaded and fine";
        }
        Curl_infof(data,fmt);
      }
    }
    else if (((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ca >> 0x1c & 1) != 0))
            && (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)
                ))) {
      Curl_infof(data,"upload completely sent off: %ld bytes",(data->req).writebytecount);
    }
  }
  else {
    Curl_bufq_reset(&(data->req).sendbuf);
    if ((data->req).writebytecount == 0) {
      if (((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ca >> 0x1c & 1) != 0)) &&
         (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))) {
        Curl_infof(data,"abort upload");
      }
    }
    else if (((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ca >> 0x1c & 1) != 0))
            && (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)
                ))) {
      Curl_infof(data,"abort upload after having sent %ld bytes",(data->req).writebytecount);
    }
  }
  CVar1 = Curl_xfer_send_close(data);
  return CVar1;
}

Assistant:

CURLcode Curl_req_set_upload_done(struct Curl_easy *data)
{
  DEBUGASSERT(!data->req.upload_done);
  data->req.upload_done = TRUE;
  data->req.keepon &= ~(KEEP_SEND|KEEP_SEND_TIMED); /* we are done sending */

  Curl_pgrsTime(data, TIMER_POSTRANSFER);
  Curl_creader_done(data, data->req.upload_aborted);

  if(data->req.upload_aborted) {
    Curl_bufq_reset(&data->req.sendbuf);
    if(data->req.writebytecount)
      infof(data, "abort upload after having sent %" FMT_OFF_T " bytes",
            data->req.writebytecount);
    else
      infof(data, "abort upload");
  }
  else if(data->req.writebytecount)
    infof(data, "upload completely sent off: %" FMT_OFF_T " bytes",
          data->req.writebytecount);
  else if(!data->req.download_done) {
    DEBUGASSERT(Curl_bufq_is_empty(&data->req.sendbuf));
    infof(data, Curl_creader_total_length(data) ?
          "We are completely uploaded and fine" :
          "Request completely sent off");
  }

  return Curl_xfer_send_close(data);
}